

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_statemachine(Curl_easy *data,connectdata *conn)

{
  _Bool local_49;
  size_t local_40;
  size_t nread;
  pingpong *pp;
  smtp_conn *smtpc;
  int smtpcode;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  smtpc._4_4_ = CURLE_OK;
  nread = (size_t)&conn->proto;
  local_40 = 0;
  pp = (pingpong *)nread;
  _smtpcode = conn;
  conn_local = (connectdata *)data;
LAB_0018bce5:
  if ((int)pp[1].sendsize == 5) {
    data_local._4_4_ = smtp_perform_upgrade_tls((Curl_easy *)conn_local);
  }
  else {
    if (*(long *)(nread + 0x18) == 0) {
      do {
        smtpc._4_4_ = Curl_pp_readresp((Curl_easy *)conn_local,0,(pingpong *)nread,(int *)&smtpc,
                                       &local_40);
        if (smtpc._4_4_ != CURLE_OK) {
          return smtpc._4_4_;
        }
        if (((int)pp[1].sendsize != 0xc) && ((int)smtpc != 1)) {
          *(int *)&conn_local[3].proxy_ssl_config.issuercert = (int)smtpc;
        }
        if ((int)smtpc == 0) {
          return CURLE_OK;
        }
        switch((int)pp[1].sendsize) {
        case 1:
          smtpc._4_4_ = smtp_state_servergreet_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          break;
        case 2:
          smtpc._4_4_ = smtp_state_ehlo_resp
                                  ((Curl_easy *)conn_local,_smtpcode,(int)smtpc,
                                   (smtpstate)pp[1].sendsize);
          break;
        case 3:
          smtpc._4_4_ = smtp_state_helo_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          break;
        case 4:
          smtpc._4_4_ = smtp_state_starttls_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          if ((smtpc._4_4_ == CURLE_OK) && ((int)pp[1].sendsize == 5)) goto LAB_0018bce5;
          break;
        case 6:
          smtpc._4_4_ = smtp_state_auth_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          break;
        case 7:
          smtpc._4_4_ = smtp_state_command_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          break;
        case 8:
          smtpc._4_4_ = smtp_state_mail_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          break;
        case 9:
          smtpc._4_4_ = smtp_state_rcpt_resp
                                  ((Curl_easy *)conn_local,_smtpcode,(int)smtpc,
                                   (smtpstate)pp[1].sendsize);
          break;
        case 10:
          smtpc._4_4_ = smtp_state_data_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          break;
        case 0xb:
          smtpc._4_4_ = smtp_state_postdata_resp
                                  ((Curl_easy *)conn_local,(int)smtpc,(smtpstate)pp[1].sendsize);
          break;
        case 0xc:
        default:
          smtp_state((Curl_easy *)conn_local,SMTP_STOP);
        }
        local_49 = false;
        if ((smtpc._4_4_ == CURLE_OK) && (local_49 = false, (int)pp[1].sendsize != 0)) {
          local_49 = Curl_pp_moredata((pingpong *)nread);
        }
        if (local_49 == false) {
          return smtpc._4_4_;
        }
      } while( true );
    }
    data_local._4_4_ = Curl_pp_flushsend((Curl_easy *)conn_local,(pingpong *)nread);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smtp_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
upgrade_tls:
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(data);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(data, smtpcode, smtpc->state);
      /* During UPGRADETLS, leave the read loop as we need to connect
       * (e.g. TLS handshake) before we continue sending/receiving. */
      if(!result && (smtpc->state == SMTP_UPGRADETLS))
        goto upgrade_tls;
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
    default:
      /* internal error */
      smtp_state(data, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}